

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

string * __thiscall
cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  string pid;
  ostringstream e;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  pcVar1 = idToString((PolicyID)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,pcVar1,(allocator<char> *)local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Policy ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," may not be set to OLD behavior because this ",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"version of CMake no longer supports it.  ",0x29);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"The policy was introduced in ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CMake version ",0xe);
  pcVar1 = idToVersion((PolicyID)this);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,", and use of NEW behavior is now required.",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Please either update your CMakeLists.txt files to conform to ",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"the new behavior or use an older version of CMake that still ",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"supports the old behavior.  ",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Run cmake --help-policy ",0x18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," for more information.",0x16);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredAlwaysPolicyError(cmPolicies::PolicyID id)
{
  std::string pid = idToString(id);
  std::ostringstream e;
  e << "Policy " << pid << " may not be set to OLD behavior because this "
    << "version of CMake no longer supports it.  "
    << "The policy was introduced in "
    << "CMake version " << idToVersion(id)
    << ", and use of NEW behavior is now required."
    << "\n"
    << "Please either update your CMakeLists.txt files to conform to "
    << "the new behavior or use an older version of CMake that still "
    << "supports the old behavior.  "
    << "Run cmake --help-policy " << pid << " for more information.";
  return e.str();
}